

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_entropy.c
# Opt level: O0

double inform_block_entropy(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  uint32_t *__nmemb;
  void *__ptr;
  double dVar2;
  undefined1 auVar3 [16];
  double be;
  inform_dist states;
  size_t N;
  uint32_t *data;
  size_t states_size;
  inform_error *err_local;
  size_t k_local;
  int b_local;
  size_t m_local;
  size_t n_local;
  int *series_local;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  if (_Var1) {
    series_local = (int *)0x7ff8000000000000;
  }
  else {
    auVar3._8_4_ = (int)(k >> 0x20);
    auVar3._0_8_ = k;
    auVar3._12_4_ = 0x45300000;
    dVar2 = pow((double)b,
                (auVar3._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    __nmemb = (uint32_t *)
              ((long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f);
    __ptr = calloc((size_t)__nmemb,4);
    if (__ptr == (void *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      series_local = (int *)0x7ff8000000000000;
    }
    else {
      states.size = n * ((m - k) + 1);
      be = (double)__ptr;
      states.histogram = __nmemb;
      states.counts = states.size;
      accumulate_observations(series,n,m,b,k,(inform_dist *)&be);
      series_local = (int *)inform_shannon_entropy((inform_dist *)&be,2.0);
      free(__ptr);
    }
  }
  return (double)series_local;
}

Assistant:

double inform_block_entropy(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const states_size = (size_t) pow((double) b, (double) k);

    uint32_t *data = calloc(states_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    size_t const N = n * (m - k + 1);

    inform_dist states = { data, states_size, N };

    accumulate_observations(series, n, m, b, k, &states);

    double be = inform_shannon_entropy(&states, 2.0);

    free(data);

    return be;
}